

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::compute_division
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *axis,
          vec<16U,_float> *centroid,weighted_vec_array *vecs,vector<unsigned_int> *indices,
          vector<unsigned_int> *left_indices,vector<unsigned_int> *right_indices)

{
  uint uVar1;
  weighted_vec *pwVar2;
  uint i_1;
  long lVar3;
  vector<unsigned_int> *this_00;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  vec<16U,_float> v;
  float local_70 [16];
  
  if (left_indices->m_size != 0) {
    left_indices->m_size = 0;
  }
  if (right_indices->m_size != 0) {
    right_indices->m_size = 0;
  }
  if (indices->m_size != 0) {
    uVar5 = 0;
    do {
      uVar1 = indices->m_p[uVar5];
      pwVar2 = vecs->m_p;
      lVar3 = 0;
      do {
        local_70[lVar3] = pwVar2[uVar1].m_vec.m_s[lVar3] - centroid->m_s[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      fVar6 = local_70[0] * axis->m_s[0];
      lVar3 = 1;
      do {
        fVar6 = fVar6 + local_70[lVar3] * axis->m_s[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      if (0.0 <= fVar6) {
        uVar4 = right_indices->m_size;
        this_00 = right_indices;
        if (right_indices->m_capacity <= uVar4) goto LAB_0013df4d;
      }
      else {
        uVar4 = left_indices->m_size;
        this_00 = left_indices;
        if (left_indices->m_capacity <= uVar4) {
LAB_0013df4d:
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar4 + 1,true,4,(object_mover)0x0,false);
        }
      }
      this_00->m_p[this_00->m_size] = uVar1;
      this_00->m_size = this_00->m_size + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < indices->m_size);
  }
  return;
}

Assistant:

void compute_division(
            const VectorType& axis, const VectorType& centroid, const weighted_vec_array& vecs, const vector<uint>& indices,
            vector<uint>& left_indices,
            vector<uint>& right_indices)
        {
            left_indices.resize(0);
            right_indices.resize(0);

            for (uint i = 0; i < indices.size(); i++)
            {
                const uint vec_index = indices[i];
                const VectorType v(vecs[vec_index].m_vec - centroid);

                float t = v * axis;
                if (t < 0.0f)
                {
                    left_indices.push_back(vec_index);
                }
                else
                {
                    right_indices.push_back(vec_index);
                }
            }
        }